

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

bool __thiscall ON_BoundingBox::GetCorners(ON_BoundingBox *this,ON_3dPoint *corners)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint *pOVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ON_BoundingBox *pOVar10;
  double *pdVar11;
  
  bVar5 = IsNotEmpty(this);
  uVar6 = 0;
  if (bVar5) {
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      pOVar10 = (ON_BoundingBox *)&this->m_max;
      if (iVar8 == 0) {
        pOVar10 = this;
      }
      dVar1 = (pOVar10->m_min).x;
      for (iVar9 = 0; iVar9 != 2; iVar9 = iVar9 + 1) {
        pOVar4 = &this->m_max;
        if (iVar9 == 0) {
          pOVar4 = &this->m_min;
        }
        dVar2 = pOVar4->y;
        pdVar11 = &corners[(int)uVar6].z;
        iVar7 = 0;
        while (iVar7 != -2) {
          bVar5 = iVar7 == 0;
          iVar7 = iVar7 + -1;
          pOVar4 = &this->m_max;
          if (bVar5) {
            pOVar4 = &this->m_min;
          }
          dVar3 = pOVar4->z;
          ((ON_3dPoint *)(pdVar11 + -2))->x = dVar1;
          pdVar11[-1] = dVar2;
          *pdVar11 = dVar3;
          pdVar11 = pdVar11 + 3;
        }
        uVar6 = uVar6 + 2;
      }
    }
    uVar6 = (uint)(uVar6 == 8);
  }
  return SUB41(uVar6,0);
}

Assistant:

bool
ON_BoundingBox::GetCorners( 
  ON_3dPoint corners[8]// returns list of 8 corner points
  ) const
{
  int n = 0;
  if ( IsValid() ) 
  {
    ON_3dPoint P;
    int i,j,k;
    for( i = 0; i < 2; i++ ) 
    {
      P.x = (i) ? m_max.x : m_min.x;
      for ( j = 0; j < 2; j++ )
      {
        P.y = (j) ? m_max.y : m_min.y;
        for ( k = 0; k < 2; k++ )
        {
          P.z = (k) ? m_max.z : m_min.z;
          corners[n++] = P;
        }
      }
    }
  }
  return (8==n);
}